

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deffunc.cpp
# Opt level: O0

ObjectPtr __thiscall ICM::DefFunc::Calc::Mod::func(Mod *this,DataList *list)

{
  Object **ppOVar1;
  Ty<8UL> *lhs;
  Ty<8UL> *rhs;
  Object *obj;
  Type *pTVar2;
  lightlist<ICM::Object_*> *in_RDX;
  Type local_40;
  Rational<long> local_38;
  Rational<long> *local_28;
  Rational<long> *rr;
  DataList *list_local;
  Mod *this_local;
  
  rr = (Rational<long> *)in_RDX;
  list_local = list;
  this_local = this;
  ppOVar1 = Common::lightlist<ICM::Object_*>::operator[](in_RDX,0);
  lhs = Object::dat<8ul>(*ppOVar1);
  ppOVar1 = Common::lightlist<ICM::Object_*>::operator[]((lightlist<ICM::Object_*> *)rr,1);
  rhs = Object::dat<8ul>(*ppOVar1);
  local_38 = Common::Number::mod<long>(lhs,rhs);
  local_28 = &local_38;
  obj = (Object *)operator_new(0x10);
  pTVar2 = Common::Number::Rational<long>::num(local_28);
  local_40 = *pTVar2;
  Objects::DataObject<(ICM::DefaultType)8>::DataObject
            ((DataObject<(ICM::DefaultType)8> *)obj,&local_40);
  ObjectPtr::ObjectPtr((ObjectPtr *)this,obj);
  return (ObjectPtr)(Object *)this;
}

Assistant:

ObjectPtr func(const DataList &list) const {
					const auto &rr = Common::Number::mod(list[0]->dat<T_Number>(), list[1]->dat<T_Number>());
					return ObjectPtr(new Number((int_t)rr.num()));
				}